

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getUNORMPacked
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<float,_4U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  pointer puVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  uint uVar3;
  undefined4 in_register_00000014;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  allocator_type local_41;
  undefined8 local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,c0);
  local_40 = CONCAT44(in_register_0000000c,c1);
  uVar4 = c2 + c3 + c1 + c0;
  if ((uVar4 & 7) != 0) {
    __assert_fail("(c0 + c1 + c2 + c3) % 8 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x347,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getUNORMPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  uVar7 = uVar4 - 8 >> 3;
  if ((7 < uVar7) || ((0x8bU >> (uVar7 & 0x1f) & 1) == 0)) {
    __assert_fail("targetPackBytes == 1 || targetPackBytes == 2 || targetPackBytes == 4 || targetPackBytes == 8"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x349,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getUNORMPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)((this->super_Image).height * (uVar4 >> 3) * (this->super_Image).width),
             &local_41);
  if ((this->super_Image).height != 0) {
    iVar2 = -(uint)(c3 != 0);
    uVar3 = 0;
    do {
      uVar6 = (this->super_Image).width;
      if (uVar6 != 0) {
        uVar5 = 0;
        do {
          if (uVar7 < 8) {
            puVar1 = (__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar6 = (uVar6 * uVar3 + uVar5) * (uVar4 >> 3);
            switch(uVar7) {
            case 0:
              if ((((0x20 < (uint)local_38) || (0x20 < (uint)local_40)) || (0x20 < c2)) ||
                 (0x20 < c3)) {
LAB_0017c022:
                __assert_fail("targetBits > 0 && targetBits <= 32",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                              ,0xef,"uint32_t imageio::convertUNORM(uint32_t, uint32_t, uint32_t)");
              }
              puVar1[uVar6] = -(c3 != 0);
              break;
            case 1:
              if (((0x20 < (uint)local_38) || (0x20 < (uint)local_40)) ||
                 ((0x20 < c2 || (0x20 < c3)))) goto LAB_0017c022;
              *(short *)(puVar1 + uVar6) = (short)iVar2;
              break;
            case 3:
              if (((0x20 < (uint)local_38) || (0x20 < (uint)local_40)) ||
                 ((0x20 < c2 || (0x20 < c3)))) goto LAB_0017c022;
              *(int *)(puVar1 + uVar6) = iVar2;
              break;
            case 7:
              if ((((0x20 < (uint)local_38) || (0x20 < (uint)local_40)) || (0x20 < c2)) ||
                 (0x20 < c3)) goto LAB_0017c022;
              puVar1 = puVar1 + uVar6;
              puVar1[0] = '\0';
              puVar1[1] = '\0';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              puVar1[4] = '\0';
              puVar1[5] = '\0';
              puVar1[6] = '\0';
              puVar1[7] = '\0';
            }
          }
          uVar5 = uVar5 + 1;
          uVar6 = (this->super_Image).width;
        } while (uVar5 < uVar6);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->super_Image).height);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<uint8_t> getUNORMPacked(
            uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert((c0 + c1 + c2 + c3) % 8 == 0);
        const auto targetPackBytes = (c0 + c1 + c2 + c3) / 8;
        assert(targetPackBytes == 1 || targetPackBytes == 2 || targetPackBytes == 4 || targetPackBytes == 8);
        const auto packC0 = c0 > 0;
        const auto packC1 = c1 > 0;
        const auto packC2 = c2 > 0;
        const auto packC3 = c3 > 0;
        const auto numChannels = (packC0 ? 1u : 0) + (packC1 ? 1u : 0) + (packC2 ? 1u : 0) + (packC3 ? 1u : 0);
        assert(numChannels <= componentCount); (void) numChannels;
        const uint32_t sourceBits = sizeof(componentType) * 8;
        static constexpr auto hasC0 = componentCount > 0;
        static constexpr auto hasC1 = componentCount > 1;
        static constexpr auto hasC2 = componentCount > 2;
        static constexpr auto hasC3 = componentCount > 3;

        std::vector<uint8_t> data(height * width * targetPackBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * targetPackBytes;

                const auto copy = [&](auto& pack) {
                    using PackType = std::remove_reference_t<decltype(pack)>;

                    if (packC0) {
                        const auto sourceValue = hasC0 ? pixel[0] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c0);
                        pack |= static_cast<PackType>(value) << (c1 + c2 + c3);
                    }
                    if (packC1) {
                        const auto sourceValue = hasC1 ? pixel[1] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c1);
                        pack |= static_cast<PackType>(value) << (c2 + c3);
                    }
                    if (packC2) {
                        const auto sourceValue = hasC2 ? pixel[2] : componentType{0};
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c2);
                        pack |= static_cast<PackType>(value) << c3;
                    }
                    if (packC3) {
                        const auto sourceValue = hasC3 ? pixel[3] : Color::one();
                        const auto value = imageio::convertUNORM(static_cast<uint32_t>(sourceValue), sourceBits, c3);
                        pack |= static_cast<PackType>(value);
                    }
                };

                if (targetPackBytes == 1) {
                    uint8_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 2) {
                    uint16_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 4) {
                    uint32_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                } else if (targetPackBytes == 8) {
                    uint64_t pack = 0;
                    copy(pack);
                    std::memcpy(target, &pack, sizeof(pack));
                }
            }
        }

        return data;
    }